

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Example.cpp
# Opt level: O0

void __thiscall Nova::Example<float,_1>::Parse(Example<float,_1> *this,int argc,char **argv)

{
  Parse_Args *this_00;
  ostream *this_01;
  undefined1 local_50 [8];
  string print_args;
  char **argv_local;
  int argc_local;
  Example<float,_1> *this_local;
  
  this_00 = (Parse_Args *)operator_new(0x98);
  Parse_Args::Parse_Args(this_00);
  this->parse_args = this_00;
  (*this->_vptr_Example[5])();
  Parse_Args::Parse(this->parse_args,argc,argv);
  Parse_Args::Print_Arguments_abi_cxx11_((Parse_Args *)local_50,argc,argv);
  this_01 = std::operator<<(this->output,(string *)local_50);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  (*this->_vptr_Example[6])();
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void Example<T,d>::
Parse(int argc,char* argv[])
{
    parse_args=new Parse_Args;
    Register_Options();

    parse_args->Parse(argc,argv);
    std::string print_args=parse_args->Print_Arguments(argc,argv);
    *output<<print_args<<std::endl;

    Parse_Options();
}